

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O0

void Service_CreateSession
               (UA_Server *server,UA_SecureChannel *channel,UA_CreateSessionRequest *request,
               UA_CreateSessionResponse *response)

{
  long lVar1;
  UA_StatusCode UVar2;
  uint local_7c;
  uint local_6c;
  UA_Session *local_60;
  UA_Session *newSession;
  size_t i;
  UA_CreateSessionResponse *response_local;
  UA_CreateSessionRequest *request_local;
  UA_SecureChannel *channel_local;
  UA_Server *server_local;
  
  if ((channel->securityToken).channelId == 0) {
    (response->responseHeader).serviceResult = 0x80220000;
  }
  else {
    i = (size_t)response;
    response_local = (UA_CreateSessionResponse *)request;
    request_local = (UA_CreateSessionRequest *)channel;
    channel_local = (UA_SecureChannel *)server;
    UVar2 = UA_Array_copy(server->endpointDescriptions,server->endpointDescriptionsSize,
                          &response->serverEndpoints,UA_TYPES + 0x9b);
    *(UA_StatusCode *)(i + 0xc) = UVar2;
    if (*(int *)(i + 0xc) == 0) {
      *(undefined8 *)(i + 0xe0) = *(undefined8 *)&channel_local->securityToken;
      for (newSession = (UA_Session *)0x0; newSession < *(UA_Session **)(i + 0xe0);
          newSession = (UA_Session *)
                       ((long)&(newSession->clientDescription).applicationUri.length + 1)) {
        UA_String_copy((UA_String *)&response_local->serverSoftwareCertificates,
                       (UA_String *)(*(long *)(i + 0xe8) + (long)newSession * 0xd8));
      }
      UVar2 = UA_SessionManager_createSession
                        ((UA_SessionManager *)&channel_local->clientAsymAlgSettings,
                         (UA_SecureChannel *)request_local,(UA_CreateSessionRequest *)response_local
                         ,&local_60);
      *(UA_StatusCode *)(i + 0xc) = UVar2;
      if (*(int *)(i + 0xc) == 0) {
        local_60->maxResponseMessageSize =
             response_local[1].responseHeader.serviceDiagnostics.namespaceUri;
        local_60->maxRequestMessageSize =
             *(UA_UInt32 *)((request_local->clientDescription).gatewayServerUri.data + 0x10);
        *(undefined8 *)(i + 0x88) = *(undefined8 *)&local_60->sessionId;
        *(size_t *)(i + 0x90) = (local_60->sessionId).identifier.string.length;
        *(UA_Byte **)(i + 0x98) = (local_60->sessionId).identifier.string.data;
        *(UA_Double *)(i + 0xb8) = local_60->timeout;
        *(undefined8 *)(i + 0xa0) = *(undefined8 *)&local_60->authenticationToken;
        *(size_t *)(i + 0xa8) = (local_60->authenticationToken).identifier.string.length;
        *(UA_Byte **)(i + 0xb0) = (local_60->authenticationToken).identifier.string.data;
        UVar2 = UA_String_copy((UA_String *)&(response_local->serverSignature).algorithm.data,
                               &local_60->sessionName);
        *(UA_StatusCode *)(i + 0xc) = UVar2;
        lVar1._0_4_ = (channel_local->securityToken).channelId;
        lVar1._4_4_ = (channel_local->securityToken).tokenId;
        if (lVar1 != 0) {
          UVar2 = UA_ByteString_copy((UA_ByteString *)
                                     ((channel_local->securityToken).createdAt + 0x88),
                                     (UA_ByteString *)(i + 0xd0));
          *(UA_StatusCode *)(i + 0xc) = UVar2 | *(uint *)(i + 0xc);
        }
        if (*(int *)(i + 0xc) == 0) {
          if ((request_local->clientDescription).gatewayServerUri.data == (UA_Byte *)0x0) {
            local_7c = 0;
          }
          else {
            local_7c = *(uint *)((request_local->clientDescription).gatewayServerUri.data + 0x38);
          }
          UA_LOG_DEBUG((UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data,
                       UA_LOGCATEGORY_SECURECHANNEL,
                       "Connection %i | SecureChannel %i | Session %08x-%04x-%04x-%02x%02x-%02x%02x%02x%02x%02x%02x created"
                       ,(ulong)local_7c,
                       (ulong)(request_local->requestHeader).authenticationToken.identifier.numeric,
                       (ulong)(local_60->sessionId).identifier.numeric,
                       (uint)(local_60->sessionId).identifier.guid.data2,
                       (uint)(local_60->sessionId).identifier.guid.data3,
                       (uint)(local_60->sessionId).identifier.guid.data4[0],
                       (uint)(local_60->sessionId).identifier.guid.data4[1],
                       (uint)(local_60->sessionId).identifier.guid.data4[2],
                       (uint)(local_60->sessionId).identifier.guid.data4[3],
                       (uint)(local_60->sessionId).identifier.guid.data4[4],
                       (uint)(local_60->sessionId).identifier.guid.data4[5],
                       (uint)(local_60->sessionId).identifier.guid.data4[6],
                       (uint)(local_60->sessionId).identifier.guid.data4[7]);
        }
        else {
          UA_SessionManager_removeSession
                    ((UA_SessionManager *)&channel_local->clientAsymAlgSettings,
                     &local_60->authenticationToken);
        }
      }
      else {
        if ((request_local->clientDescription).gatewayServerUri.data == (UA_Byte *)0x0) {
          local_6c = 0;
        }
        else {
          local_6c = *(uint *)((request_local->clientDescription).gatewayServerUri.data + 0x38);
        }
        UA_LOG_DEBUG((UA_Logger)(channel_local->serverAsymAlgSettings).senderCertificate.data,
                     UA_LOGCATEGORY_SECURECHANNEL,
                     "Connection %i | SecureChannel %i | Processing CreateSessionRequest failed",
                     (ulong)local_6c,
                     (ulong)(request_local->requestHeader).authenticationToken.identifier.numeric);
      }
    }
  }
  return;
}

Assistant:

void Service_CreateSession(UA_Server *server, UA_SecureChannel *channel,
                           const UA_CreateSessionRequest *request,
                           UA_CreateSessionResponse *response) {
    if(channel->securityToken.channelId == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSECURECHANNELIDINVALID;
        return;
    }

    /* Copy the server's endpoint into the response */
    response->responseHeader.serviceResult =
        UA_Array_copy(server->endpointDescriptions, server->endpointDescriptionsSize,
                      (void**)&response->serverEndpoints, &UA_TYPES[UA_TYPES_ENDPOINTDESCRIPTION]);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD)
        return;
    response->serverEndpointsSize = server->endpointDescriptionsSize;

    /* Mirror back the endpointUrl */
    for(size_t i = 0; i < response->serverEndpointsSize; ++i)
        UA_String_copy(&request->endpointUrl, &response->serverEndpoints[i].endpointUrl);

    UA_Session *newSession;
    response->responseHeader.serviceResult =
        UA_SessionManager_createSession(&server->sessionManager, channel, request, &newSession);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Processing CreateSessionRequest failed");
        return;
    }

    newSession->maxResponseMessageSize = request->maxResponseMessageSize;
    newSession->maxRequestMessageSize = channel->connection->localConf.maxMessageSize;
    response->sessionId = newSession->sessionId;
    response->revisedSessionTimeout = (UA_Double)newSession->timeout;
    response->authenticationToken = newSession->authenticationToken;
    response->responseHeader.serviceResult = UA_String_copy(&request->sessionName, &newSession->sessionName);
    if(server->endpointDescriptionsSize > 0)
        response->responseHeader.serviceResult |=
            UA_ByteString_copy(&server->endpointDescriptions->serverCertificate,
                               &response->serverCertificate);
    if(response->responseHeader.serviceResult != UA_STATUSCODE_GOOD) {
        UA_SessionManager_removeSession(&server->sessionManager, &newSession->authenticationToken);
         return;
    }
    UA_LOG_DEBUG_CHANNEL(server->config.logger, channel, "Session " UA_PRINTF_GUID_FORMAT " created",
                         UA_PRINTF_GUID_DATA(newSession->sessionId.identifier.guid));
}